

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O3

void __thiscall
gui::DialogBox::setSubmitButton(DialogBox *this,size_t index,shared_ptr<gui::Button> *button)

{
  shared_ptr<gui::Button> local_28;
  
  local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  setOptionButton(this,index,&local_28);
  if (local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this->submitIndex_ =
       -(ulong)((button->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
               (element_type *)0x0) | index;
  return;
}

Assistant:

void DialogBox::setSubmitButton(size_t index, std::shared_ptr<Button> button) {
    setOptionButton(index, button);
    submitIndex_ = (button != nullptr ? index : std::numeric_limits<size_t>::max());
}